

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall
cmExtraCodeLiteGenerator::CreateNewProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  _Base_ptr *pp_Var1;
  cmMakefile *mf;
  pointer ppcVar2;
  cmLocalGenerator *pcVar3;
  pointer puVar4;
  cmMakefile *makefile;
  pointer ppcVar5;
  char *this_00;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  pointer puVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  cFiles;
  string projectPath;
  string projectType;
  string local_340;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherFiles;
  cmXMLWriter xml;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,filename,false,None);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fout,0);
    cmXMLWriter::StartDocument(&xml,"utf-8");
    pp_Var1 = &cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    cFiles._M_t._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cFiles,"CodeLite_Project","");
    cmXMLWriter::StartElement(&xml,(string *)&cFiles);
    if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&cFiles,
               *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                _M_impl.super__Vector_impl_data._M_start);
    cmXMLWriter::Attribute<std::__cxx11::string>
              (&xml,"Name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cFiles);
    if ((_Base_ptr *)cFiles._M_t._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)cFiles._M_t._M_impl._0_8_,
                      (ulong)((long)&(cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    this_00 = "InternalType";
    cmXMLWriter::Attribute<char[1]>(&xml,"InternalType",(char (*) [1])0x71dc05);
    projectType._M_dataplus._M_p = (pointer)&projectType.field_2;
    projectType._M_string_length = 0;
    projectType.field_2._M_local_buf[0] = '\0';
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &otherFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar5 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar2 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         cFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         otherFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar5 != ppcVar2) {
      do {
        pcVar3 = *ppcVar5;
        puVar6 = (pcVar3->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (pcVar3->GeneratorTargets).
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar6 != puVar4) {
          makefile = pcVar3->Makefile;
          do {
            CollectSourceFiles(&projectPath,(cmExtraCodeLiteGenerator *)this_00,makefile,
                               (puVar6->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                               .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                               &cFiles,&otherFiles);
            this_00 = (char *)&projectPath;
            std::__cxx11::string::operator=((string *)&projectType,(string *)&projectPath);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
              this_00 = (char *)(projectPath.field_2._M_allocated_capacity + 1);
              operator_delete(projectPath._M_dataplus._M_p,(ulong)this_00);
            }
            puVar6 = puVar6 + 1;
          } while (puVar6 != puVar4);
        }
        ppcVar5 = ppcVar5 + 1;
      } while (ppcVar5 != ppcVar2);
    }
    cmsys::SystemTools::GetFilenamePath(&projectPath,filename);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"");
    CreateProjectSourceEntries
              (this,&cFiles,&otherFiles,&xml,&projectPath,mf,&projectType,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::EndElement(&xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectPath._M_dataplus._M_p != &projectPath.field_2) {
      operator_delete(projectPath._M_dataplus._M_p,projectPath.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&otherFiles._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
    ::~_Rb_tree(&cFiles._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projectType._M_dataplus._M_p != &projectType.field_2) {
      operator_delete(projectType._M_dataplus._M_p,
                      CONCAT71(projectType.field_2._M_allocated_capacity._1_7_,
                               projectType.field_2._M_local_buf[0]) + 1);
    }
    cmXMLWriter::~cmXMLWriter(&xml);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateNewProjectFile(
  const std::vector<cmLocalGenerator*>& lgs, const std::string& filename)
{
  const cmMakefile* mf = lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  ////////////////////////////////////
  xml.StartDocument("utf-8");
  xml.StartElement("CodeLite_Project");
  xml.Attribute("Name", lgs[0]->GetProjectName());
  xml.Attribute("InternalType", "");

  std::string projectType;

  // Collect all used source files in the project
  // Sort them into two containers, one for C/C++ implementation files
  // which may have an accompanying header, one for all other files
  std::map<std::string, cmSourceFile*> cFiles;
  std::set<std::string> otherFiles;

  for (cmLocalGenerator* lg : lgs) {
    cmMakefile* makefile = lg->GetMakefile();
    for (const auto& target : lg->GetGeneratorTargets()) {
      projectType =
        this->CollectSourceFiles(makefile, target.get(), cFiles, otherFiles);
    }
  }

  // Get the project path ( we need it later to convert files to
  // their relative path)
  std::string projectPath = cmSystemTools::GetFilenamePath(filename);

  this->CreateProjectSourceEntries(cFiles, otherFiles, &xml, projectPath, mf,
                                   projectType, "");

  xml.EndElement(); // CodeLite_Project
}